

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGXMLScanner.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DGXMLScanner::updateNSMap
          (DGXMLScanner *this,XMLCh *attrPrefix,XMLCh *attrLocalName,XMLCh *attrValue)

{
  XMLCh XVar1;
  XMLCh XVar2;
  XMLStringPool *pXVar3;
  uint uriId;
  XMLCh *pXVar4;
  XMLCh *pXVar5;
  Codes CVar6;
  
  if ((attrPrefix == (XMLCh *)0x0) || (*attrPrefix == L'\0')) {
LAB_00298006:
    if (attrValue != L"http://www.w3.org/2000/xmlns/") {
      if (attrValue == (XMLCh *)0x0) goto LAB_00298054;
      pXVar4 = L"http://www.w3.org/2000/xmlns/";
      pXVar5 = attrValue;
      do {
        XVar1 = *pXVar5;
        if (XVar1 == L'\0') goto LAB_0029805b;
        pXVar5 = pXVar5 + 1;
        XVar2 = *pXVar4;
        pXVar4 = pXVar4 + 1;
      } while (XVar1 == XVar2);
      goto LAB_00298061;
    }
LAB_00298093:
    CVar6 = NoUseOfxmlnsURI;
  }
  else {
    CVar6 = NoUseOfxmlnsAsPrefix;
    if (attrLocalName != L"xmlns") {
      pXVar4 = L"xmlns";
      pXVar5 = attrLocalName;
      if (attrLocalName == (XMLCh *)0x0) {
LAB_00297f50:
        if (*pXVar4 == L'\0') goto LAB_00297fd0;
      }
      else {
        do {
          XVar1 = *pXVar5;
          if (XVar1 == L'\0') goto LAB_00297f50;
          XVar2 = *pXVar4;
          pXVar4 = pXVar4 + 1;
          pXVar5 = pXVar5 + 1;
        } while (XVar1 == XVar2);
      }
      if (attrLocalName != L"xml") {
        pXVar4 = L"xml";
        pXVar5 = attrLocalName;
        if (attrLocalName == (XMLCh *)0x0) {
LAB_00297f88:
          if (*pXVar4 == L'\0') goto LAB_00297f8e;
        }
        else {
          do {
            XVar1 = *pXVar5;
            if (XVar1 == L'\0') goto LAB_00297f88;
            XVar2 = *pXVar4;
            pXVar4 = pXVar4 + 1;
            pXVar5 = pXVar5 + 1;
          } while (XVar1 == XVar2);
        }
        goto LAB_00297fd8;
      }
LAB_00297f8e:
      if (attrValue != L"http://www.w3.org/XML/1998/namespace") {
        pXVar4 = L"http://www.w3.org/XML/1998/namespace";
        pXVar5 = attrValue;
        if (attrValue == (XMLCh *)0x0) {
LAB_00297fc5:
          CVar6 = PrefixXMLNotMatchXMLURI;
          if (*pXVar4 == L'\0') goto LAB_00297fd8;
        }
        else {
          do {
            XVar1 = *pXVar5;
            if (XVar1 == L'\0') goto LAB_00297fc5;
            XVar2 = *pXVar4;
            pXVar4 = pXVar4 + 1;
            pXVar5 = pXVar5 + 1;
          } while (XVar1 == XVar2);
          CVar6 = PrefixXMLNotMatchXMLURI;
        }
        goto LAB_00297fd0;
      }
LAB_00297fdd:
      if ((*attrValue == L'\0') && ((this->super_XMLScanner).fXMLVersion == XMLV1_0)) {
        XMLScanner::emitError
                  (&this->super_XMLScanner,NoEmptyStrNamespace,attrLocalName,(XMLCh *)0x0,
                   (XMLCh *)0x0,(XMLCh *)0x0);
      }
      goto LAB_00298006;
    }
LAB_00297fd0:
    XMLScanner::emitError(&this->super_XMLScanner,CVar6);
LAB_00297fd8:
    if (attrValue != (XMLCh *)0x0) goto LAB_00297fdd;
    XMLScanner::emitError
              (&this->super_XMLScanner,NoEmptyStrNamespace,attrLocalName,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
LAB_00298054:
    pXVar4 = L"http://www.w3.org/2000/xmlns/";
LAB_0029805b:
    if (*pXVar4 == L'\0') goto LAB_00298093;
LAB_00298061:
    if (attrValue == L"http://www.w3.org/XML/1998/namespace") {
      if (attrLocalName == L"xml") goto LAB_002980a0;
    }
    else {
      pXVar4 = L"http://www.w3.org/XML/1998/namespace";
      pXVar5 = attrValue;
      if (attrValue != (XMLCh *)0x0) {
        do {
          XVar1 = *pXVar5;
          if (XVar1 == L'\0') goto LAB_002980c9;
          XVar2 = *pXVar4;
          pXVar4 = pXVar4 + 1;
          pXVar5 = pXVar5 + 1;
        } while (XVar1 == XVar2);
        goto LAB_002980a0;
      }
LAB_002980c9:
      if ((attrLocalName == L"xml") || (*pXVar4 != L'\0')) goto LAB_002980a0;
    }
    pXVar4 = L"xml";
    pXVar5 = attrLocalName;
    if (attrLocalName == (XMLCh *)0x0) {
LAB_00298111:
      CVar6 = XMLURINotMatchXMLPrefix;
      if (*pXVar4 == L'\0') goto LAB_002980a0;
    }
    else {
      do {
        XVar1 = *pXVar5;
        if (XVar1 == L'\0') goto LAB_00298111;
        XVar2 = *pXVar4;
        pXVar4 = pXVar4 + 1;
        pXVar5 = pXVar5 + 1;
      } while (XVar1 == XVar2);
      CVar6 = XMLURINotMatchXMLPrefix;
    }
  }
  XMLScanner::emitError(&this->super_XMLScanner,CVar6);
LAB_002980a0:
  pXVar3 = (this->super_XMLScanner).fURIStringPool;
  uriId = (*(pXVar3->super_XSerializable)._vptr_XSerializable[5])(pXVar3,attrValue);
  ElemStack::addPrefix(&(this->super_XMLScanner).fElemStack,attrLocalName,uriId);
  return;
}

Assistant:

void DGXMLScanner::updateNSMap(const    XMLCh* const attrPrefix
                               , const  XMLCh* const attrLocalName
                               , const  XMLCh* const attrValue)
{
    //  We either have the default prefix (""), or we point it into the attr
    //  name parameter. Note that the xmlns is not the prefix we care about
    //  here. To us, the 'prefix' is really the local part of the attrName
    //  parameter.
    //
    //  Check 1. xxx is not xmlns
    //        2. if xxx is xml, then yyy must match XMLUni::fgXMLURIName, and vice versa
    //        3. yyy is not XMLUni::fgXMLNSURIName
    //        4. if xxx is not null, then yyy cannot be an empty string.
    if (attrPrefix && *attrPrefix) {

        if (XMLString::equals(attrLocalName, XMLUni::fgXMLNSString))
            emitError(XMLErrs::NoUseOfxmlnsAsPrefix);
        else if (XMLString::equals(attrLocalName, XMLUni::fgXMLString)) {
            if (!XMLString::equals(attrValue, XMLUni::fgXMLURIName))
                emitError(XMLErrs::PrefixXMLNotMatchXMLURI);
        }

        if (!attrValue)
            emitError(XMLErrs::NoEmptyStrNamespace, attrLocalName);
        else if(!*attrValue && fXMLVersion == XMLReader::XMLV1_0)
            emitError(XMLErrs::NoEmptyStrNamespace, attrLocalName);
    }

    if (XMLString::equals(attrValue, XMLUni::fgXMLNSURIName))
        emitError(XMLErrs::NoUseOfxmlnsURI);
    else if (XMLString::equals(attrValue, XMLUni::fgXMLURIName)) {
        if (!XMLString::equals(attrLocalName, XMLUni::fgXMLString))
            emitError(XMLErrs::XMLURINotMatchXMLPrefix);
    }

    //  Ok, we have to get the unique id for the attribute value, which is the
    //  URI that this value should be mapped to. The validator has the
    //  namespace string pool, so we ask him to find or add this new one. Then
    //  we ask the element stack to add this prefix to URI Id mapping.
    fElemStack.addPrefix
    (
        attrLocalName
        , fURIStringPool->addOrFind(attrValue)
    );
}